

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::repeated(QString *this,qsizetype times)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  char16_t *pcVar3;
  char16_t *__src;
  long in_RDX;
  QArrayDataPointer<char16_t> *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  qsizetype halfResultSize;
  char16_t *end;
  qsizetype sizeSoFar;
  qsizetype resultSize;
  QString result;
  QString *in_stack_ffffffffffffff48;
  QString *in_stack_ffffffffffffff50;
  QString *in_stack_ffffffffffffff60;
  QString *asize;
  QString *local_68;
  long local_60;
  QArrayDataPointer<char16_t> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI->size == 0) {
    QString(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  else if (in_RDX < 2) {
    if (in_RDX == 1) {
      QString(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    else {
      QString((QString *)0x519a44);
    }
  }
  else {
    puVar1 = (undefined1 *)(in_RDX * in_RSI->size);
    local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    asize = in_RDI;
    QString((QString *)0x519a93);
    reserve(in_stack_ffffffffffffff60,(qsizetype)asize);
    puVar2 = (undefined1 *)capacity((QString *)0x519ab1);
    if (puVar2 == puVar1) {
      pcVar3 = QArrayDataPointer<char16_t>::data(&local_28);
      __src = QArrayDataPointer<char16_t>::data(in_RSI);
      memcpy(pcVar3,__src,in_RSI->size << 1);
      local_60 = in_RSI->size;
      pcVar3 = QArrayDataPointer<char16_t>::data(&local_28);
      local_68 = (QString *)(pcVar3 + local_60);
      for (; local_60 <= (long)puVar1 >> 1; local_60 = local_60 << 1) {
        pcVar3 = QArrayDataPointer<char16_t>::data(&local_28);
        memcpy(local_68,pcVar3,local_60 << 1);
        local_68 = (QString *)((long)&(local_68->d).d + local_60 * 2);
      }
      pcVar3 = QArrayDataPointer<char16_t>::data(&local_28);
      memcpy(local_68,pcVar3,((long)puVar1 - local_60) * 2);
      pcVar3 = QArrayDataPointer<char16_t>::data(&local_28);
      pcVar3[(long)puVar1] = L'\0';
      local_28.size = (qsizetype)puVar1;
      QString(local_68,in_stack_ffffffffffffff48);
    }
    else {
      QString((QString *)0x519ace);
    }
    ~QString((QString *)0x519c42);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QString::repeated(qsizetype times) const
{
    if (d.size == 0)
        return *this;

    if (times <= 1) {
        if (times == 1)
            return *this;
        return QString();
    }

    const qsizetype resultSize = times * d.size;

    QString result;
    result.reserve(resultSize);
    if (result.capacity() != resultSize)
        return QString(); // not enough memory

    memcpy(result.d.data(), d.data(), d.size * sizeof(QChar));

    qsizetype sizeSoFar = d.size;
    char16_t *end = result.d.data() + sizeSoFar;

    const qsizetype halfResultSize = resultSize >> 1;
    while (sizeSoFar <= halfResultSize) {
        memcpy(end, result.d.data(), sizeSoFar * sizeof(QChar));
        end += sizeSoFar;
        sizeSoFar <<= 1;
    }
    memcpy(end, result.d.data(), (resultSize - sizeSoFar) * sizeof(QChar));
    result.d.data()[resultSize] = '\0';
    result.d.size = resultSize;
    return result;
}